

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O3

void __thiscall
wabt::BindingHash::SortDuplicatesVectorByLocation(BindingHash *this,ValueTypeVector *duplicates)

{
  int iVar1;
  int iVar2;
  pointer pppVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar5;
  long lVar6;
  ulong uVar7;
  pointer pppVar8;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_**,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __i;
  pointer pppVar9;
  
  pppVar8 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pppVar3 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pppVar8 != pppVar3) {
    uVar7 = (long)pppVar3 - (long)pppVar8 >> 3;
    lVar6 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
              (pppVar8,pppVar3,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pppVar3 - (long)pppVar8 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
                (pppVar8,pppVar3);
      return;
    }
    pppVar9 = pppVar8 + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
              (pppVar8,pppVar9);
    for (; pppVar9 != pppVar3; pppVar9 = pppVar9 + 1) {
      ppVar4 = *pppVar9;
      pppVar8 = pppVar9;
      while( true ) {
        ppVar5 = pppVar8[-1];
        iVar1 = (ppVar5->second).loc.field_1.field_0.line;
        iVar2 = (ppVar4->second).loc.field_1.field_0.line;
        if ((iVar1 <= iVar2) &&
           ((iVar2 != iVar1 ||
            ((ppVar5->second).loc.field_1.field_0.first_column <=
             (ppVar4->second).loc.field_1.field_0.first_column)))) break;
        *pppVar8 = ppVar5;
        pppVar8 = pppVar8 + -1;
      }
      *pppVar8 = ppVar4;
    }
  }
  return;
}

Assistant:

void BindingHash::SortDuplicatesVectorByLocation(
    ValueTypeVector* duplicates) const {
  std::sort(
      duplicates->begin(), duplicates->end(),
      [](const value_type* lhs, const value_type* rhs) -> bool {
        return lhs->second.loc.line < rhs->second.loc.line ||
               (lhs->second.loc.line == rhs->second.loc.line &&
                lhs->second.loc.first_column < rhs->second.loc.first_column);
      });
}